

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_19bb9b::SymlinkCommand::isResultValid
          (SymlinkCommand *this,BuildSystem *system,BuildValue *value)

{
  BuildNode *pBVar1;
  pointer pcVar2;
  long *plVar3;
  bool bVar4;
  FileInfo *rhs;
  string *psVar5;
  size_type sVar6;
  FileInfo info;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  FileInfo local_70;
  
  sVar6 = (this->linkOutputPath)._M_string_length;
  if (sVar6 == 0) {
    pBVar1 = *(this->super_Command).outputs.
              super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar6 = (pBVar1->super_Node).name._M_string_length;
    psVar5 = &(pBVar1->super_Node).name;
  }
  else {
    psVar5 = &this->linkOutputPath;
  }
  if (((this->super_Command).outputs.
       super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->super_Command).outputs.
       super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (sVar6 != 0)) {
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    if (((value->kind == SuccessfulCommandWithOutputSignature) || (value->kind == SuccessfulCommand)
        ) && (value->numOutputInfos == 1)) {
      plVar3 = *(long **)((long)system->impl + 0x10);
      local_90 = &local_80;
      if (pcVar2 == (pointer)0x0) {
        local_88 = 0;
        local_80 = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar2,pcVar2 + sVar6);
      }
      (**(code **)(*plVar3 + 0x40))(&local_70,plVar3,&local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
      }
      if ((((local_70.device != 0) || (local_70.inode != 0)) || (local_70.mode != 0)) ||
         (((local_70.size != 0 || (local_70.modTime.seconds != 0)) ||
          (local_70.modTime.nanoseconds != 0)))) {
        rhs = llbuild::buildsystem::BuildValue::getOutputInfo(value);
        bVar4 = llbuild::basic::FileInfo::operator==(&local_70,rhs);
        return bVar4;
      }
    }
  }
  return false;
}

Assistant:

virtual bool isResultValid(BuildSystem& system,
                             const BuildValue& value) override {
    // It is an error if this command isn't configured properly.
    StringRef outputPath = getActualOutputPath();
    if (outputs.empty() || outputPath.empty())
      return false;

    // If the prior value wasn't for a successful command, recompute.
    if (!value.isSuccessfulCommand())
      return false;

    // If the prior command doesn't look like one for a link, recompute.
    if (value.getNumOutputs() != 1)
      return false;

    // Otherwise, assume the result is valid if its link status matches the
    // previous one.
    auto info = system.getFileSystem().getLinkInfo(outputPath);
    if (info.isMissing())
      return false;

    return info == value.getOutputInfo();
  }